

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_SET_OF.c
# Opt level: O1

asn_dec_rval_t
SET_OF_decode_xer(asn_codec_ctx_t *opt_codec_ctx,asn_TYPE_descriptor_t *td,void **struct_ptr,
                 char *opt_mname,void *buf_ptr,size_t size)

{
  short *psVar1;
  asn_TYPE_member_s *paVar2;
  int *piVar3;
  bool bVar4;
  undefined8 asn_set_of_x;
  void **ppvVar5;
  ssize_t sVar9;
  ulong uVar10;
  int iVar6;
  xer_check_tag_e xVar7;
  long lVar8;
  asn_dec_rval_t aVar12;
  long extraout_RDX;
  size_t num;
  size_t sVar11;
  asn_anonymous_set_ *list;
  pxer_chunk_type_e ch_type;
  undefined1 local_7c [20];
  char *local_68;
  pxer_chunk_type_e local_54;
  char *local_50;
  void **local_48;
  asn_codec_ctx_t *local_40;
  int *local_38;
  
  local_50 = opt_mname;
  if (opt_mname == (char *)0x0) {
    local_50 = td->xml_tag;
  }
  paVar2 = td->elements;
  piVar3 = (int *)td->specifics;
  local_7c._12_8_ = *struct_ptr;
  local_40 = opt_codec_ctx;
  if ((void *)local_7c._12_8_ == (void *)0x0) {
    local_7c._12_8_ = calloc(1,(long)*piVar3);
    *struct_ptr = (void *)local_7c._12_8_;
    if ((void *)local_7c._12_8_ == (void *)0x0) {
      uVar10 = 2;
      local_7c._4_8_ = 0;
      goto LAB_00146a0f;
    }
  }
  asn_set_of_x = local_7c._12_8_;
  if (piVar3[2] == 0) {
    local_68 = paVar2->name;
    if (*local_68 == '\0') {
      local_68 = paVar2->type->xml_tag;
    }
  }
  else {
    local_68 = (char *)0x0;
    if (piVar3[2] != 1) {
      local_68 = "";
    }
  }
  lVar8 = (long)piVar3[1];
  psVar1 = (short *)(local_7c._12_8_ + lVar8);
  local_48 = (void **)(local_7c._12_8_ + lVar8 + 8);
  local_38 = (int *)(local_7c._12_8_ + lVar8 + 4);
  sVar11 = 0;
  do {
    ppvVar5 = local_48;
    if (2 < *psVar1) goto LAB_001469ed;
    if (*psVar1 == 2) {
      aVar12.code = (*paVar2->type->xer_decoder)
                              (local_40,paVar2->type,local_48,local_68,buf_ptr,size);
      if (aVar12.code == (asn_dec_rval_t)0x0) {
        iVar6 = asn_set_add((void *)asn_set_of_x,*ppvVar5);
        if (iVar6 == 0) {
          *ppvVar5 = (void *)0x0;
          buf_ptr = (void *)((long)buf_ptr + extraout_RDX);
          size = size - extraout_RDX;
          sVar11 = sVar11 + extraout_RDX;
          *psVar1 = 1;
          bVar4 = true;
        }
        else {
          local_7c._0_4_ = RC_FAIL;
          local_7c._4_4_ = 0;
          local_7c._8_8_ = 2;
          local_7c._0_4_ = CONCAT124(local_7c._4_12_,local_7c._0_4_);
          bVar4 = false;
          local_7c._4_8_ = sVar11;
        }
      }
      else {
        buf_ptr = (void *)((long)buf_ptr + extraout_RDX);
        size = size - extraout_RDX;
        sVar11 = sVar11 + extraout_RDX;
        bVar4 = false;
        local_7c._0_4_ = (undefined4)aVar12.code;
        local_7c._4_8_ = sVar11;
      }
      iVar6 = 1;
      if (bVar4) goto LAB_001468f0;
      goto LAB_0014694f;
    }
LAB_001468f0:
    sVar9 = xer_next_token(local_38,buf_ptr,size,&local_54);
    if (sVar9 == -1) {
      local_7c._0_4_ = RC_FAIL;
      local_7c._4_4_ = 0;
      local_7c._8_8_ = 2;
      local_7c._0_4_ = CONCAT124(local_7c._4_12_,local_7c._0_4_);
LAB_0014694a:
      iVar6 = 1;
      local_7c._4_8_ = sVar11;
      goto LAB_0014694f;
    }
    if (local_54 - PXER_TEXT < 2) {
      buf_ptr = (void *)((long)buf_ptr + sVar9);
      size = size - sVar9;
      sVar11 = sVar11 + sVar9;
      goto LAB_00146923;
    }
    if (local_54 == PXER_WMORE) {
      local_7c._0_4_ = RC_WMORE;
      local_7c._4_4_ = 0;
      local_7c._8_8_ = 1;
      local_7c._0_4_ = CONCAT124(local_7c._4_12_,local_7c._0_4_);
      goto LAB_0014694a;
    }
    xVar7 = xer_check_tag(buf_ptr,(int)sVar9,local_50);
    switch(xVar7) {
    case XCT_OPENING:
      goto switchD_00146982_caseD_1;
    case XCT_CLOSING:
      if (*psVar1 != 0) {
        *psVar1 = 0;
        goto switchD_00146982_caseD_3;
      }
    default:
switchD_00146982_caseD_4:
      iVar6 = 4;
      break;
    case XCT_BOTH:
switchD_00146982_caseD_3:
      if (*psVar1 == 0) {
        buf_ptr = (void *)((long)buf_ptr + sVar9);
        size = size - sVar9;
        sVar11 = sVar11 + sVar9;
        *psVar1 = 3;
        local_7c._0_4_ = RC_OK;
        local_7c._4_4_ = 0;
        local_7c._8_8_ = 0;
        local_7c._0_4_ = CONCAT124(local_7c._4_12_,local_7c._0_4_);
        goto LAB_0014694a;
      }
switchD_00146982_caseD_1:
      if (*psVar1 == 0) {
        buf_ptr = (void *)((long)buf_ptr + sVar9);
        size = size - sVar9;
        sVar11 = sVar11 + sVar9;
        *psVar1 = 1;
      }
      else {
switchD_00146982_caseD_5:
        if (*psVar1 != 1) goto switchD_00146982_caseD_4;
        *psVar1 = 2;
      }
LAB_00146923:
      iVar6 = 5;
      break;
    case XCT_UNKNOWN_OP:
    case XCT_UNKNOWN_BO:
      goto switchD_00146982_caseD_5;
    }
LAB_0014694f:
  } while (iVar6 == 5);
  if (iVar6 == 4) {
LAB_001469ed:
    local_7c._4_8_ = sVar11;
    *psVar1 = 3;
    uVar10 = 2;
  }
  else {
    uVar10 = (ulong)(uint)local_7c._0_4_;
  }
LAB_00146a0f:
  aVar12.consumed = local_7c._4_8_;
  aVar12._0_8_ = uVar10;
  return aVar12;
}

Assistant:

asn_dec_rval_t
SET_OF_decode_xer(asn_codec_ctx_t *opt_codec_ctx, asn_TYPE_descriptor_t *td,
	void **struct_ptr, const char *opt_mname,
		const void *buf_ptr, size_t size) {
	/*
	 * Bring closer parts of structure description.
	 */
	asn_SET_OF_specifics_t *specs = (asn_SET_OF_specifics_t *)td->specifics;
	asn_TYPE_member_t *element = td->elements;
	const char *elm_tag;
	const char *xml_tag = opt_mname ? opt_mname : td->xml_tag;

	/*
	 * ... and parts of the structure being constructed.
	 */
	void *st = *struct_ptr;	/* Target structure. */
	asn_struct_ctx_t *ctx;	/* Decoder context */

	asn_dec_rval_t rval;		/* Return value from a decoder */
	ssize_t consumed_myself = 0;	/* Consumed bytes from ptr */

	/*
	 * Create the target structure if it is not present already.
	 */
	if(st == 0) {
		st = *struct_ptr = CALLOC(1, specs->struct_size);
		if(st == 0) RETURN(RC_FAIL);
	}

	/* Which tag is expected for the downstream */
	if(specs->as_XMLValueList) {
		elm_tag = (specs->as_XMLValueList == 1) ? 0 : "";
	} else {
		elm_tag = (*element->name)
				? element->name : element->type->xml_tag;
	}

	/*
	 * Restore parsing context.
	 */
	ctx = (asn_struct_ctx_t *)((char *)st + specs->ctx_offset);

	/*
	 * Phases of XER/XML processing:
	 * Phase 0: Check that the opening tag matches our expectations.
	 * Phase 1: Processing body and reacting on closing tag.
	 * Phase 2: Processing inner type.
	 */
	for(; ctx->phase <= 2;) {
		pxer_chunk_type_e ch_type;	/* XER chunk type */
		ssize_t ch_size;		/* Chunk size */
		xer_check_tag_e tcv;		/* Tag check value */

		/*
		 * Go inside the inner member of a set.
		 */
		if(ctx->phase == 2) {
			asn_dec_rval_t tmprval;

			/* Invoke the inner type decoder, m.b. multiple times */
			ASN_DEBUG("XER/SET OF element [%s]", elm_tag);
			tmprval = element->type->xer_decoder(opt_codec_ctx,
					element->type, &ctx->ptr, elm_tag,
					buf_ptr, size);
			if(tmprval.code == RC_OK) {
				asn_anonymous_set_ *list = _A_SET_FROM_VOID(st);
				if(ASN_SET_ADD(list, ctx->ptr) != 0)
					RETURN(RC_FAIL);
				ctx->ptr = 0;
				XER_ADVANCE(tmprval.consumed);
			} else {
				XER_ADVANCE(tmprval.consumed);
				RETURN(tmprval.code);
			}
			ctx->phase = 1;	/* Back to body processing */
			ASN_DEBUG("XER/SET OF phase => %d", ctx->phase);
			/* Fall through */
		}

		/*
		 * Get the next part of the XML stream.
		 */
		ch_size = xer_next_token(&ctx->context,
			buf_ptr, size, &ch_type);
		if(ch_size == -1) {
            RETURN(RC_FAIL);
        } else {
			switch(ch_type) {
            case PXER_WMORE:
                RETURN(RC_WMORE);
			case PXER_COMMENT:	/* Got XML comment */
			case PXER_TEXT:		/* Ignore free-standing text */
				XER_ADVANCE(ch_size);	/* Skip silently */
				continue;
			case PXER_TAG:
				break;	/* Check the rest down there */
			}
		}

		tcv = xer_check_tag(buf_ptr, ch_size, xml_tag);
		ASN_DEBUG("XER/SET OF: tcv = %d, ph=%d t=%s",
			tcv, ctx->phase, xml_tag);
		switch(tcv) {
		case XCT_CLOSING:
			if(ctx->phase == 0) break;
			ctx->phase = 0;
			/* Fall through */
		case XCT_BOTH:
			if(ctx->phase == 0) {
				/* No more things to decode */
				XER_ADVANCE(ch_size);
				ctx->phase = 3;	/* Phase out */
				RETURN(RC_OK);
			}
			/* Fall through */
		case XCT_OPENING:
			if(ctx->phase == 0) {
				XER_ADVANCE(ch_size);
				ctx->phase = 1;	/* Processing body phase */
				continue;
			}
			/* Fall through */
		case XCT_UNKNOWN_OP:
		case XCT_UNKNOWN_BO:

			ASN_DEBUG("XER/SET OF: tcv=%d, ph=%d", tcv, ctx->phase);
			if(ctx->phase == 1) {
				/*
				 * Process a single possible member.
				 */
				ctx->phase = 2;
				continue;
			}
			/* Fall through */
		default:
			break;
		}

		ASN_DEBUG("Unexpected XML tag in SET OF");
		break;
	}

	ctx->phase = 3;	/* "Phase out" on hard failure */
	RETURN(RC_FAIL);
}